

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::SubmitTxMemoryPoolAndRelay
          (CWallet *this,CWalletTx *wtx,string *err_string,bool relay)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Chain *pCVar4;
  byte in_CL;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  bool ret;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  CWalletTx *in_stack_ffffffffffffff88;
  CWallet *this_00;
  undefined4 in_stack_ffffffffffffff98;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff9c;
  CWallet *in_stack_ffffffffffffffa0;
  CWallet *this_01;
  bool local_2a;
  ConstevalFormatString<1U> wallet_fmt;
  
  wallet_fmt.fmt = *(char **)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff88,
             (char *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c,(AnnotatedMixin<std::recursive_mutex> *)0xae394c);
  bVar1 = GetBroadcastTransactions
                    ((CWallet *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (bVar1) {
    bVar1 = CWalletTx::isAbandoned(in_stack_ffffffffffffff88);
    if (bVar1) {
      local_2a = false;
    }
    else {
      bVar1 = CWalletTx::IsCoinBase
                        ((CWalletTx *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
      ;
      if (bVar1) {
        local_2a = false;
      }
      else {
        iVar2 = GetTxDepthInMainChain
                          (in_stack_ffffffffffffffa0,
                           (CWalletTx *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if (iVar2 == 0) {
          CWalletTx::GetHash((CWalletTx *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          this_00 = (CWallet *)&stack0xffffffffffffffd8;
          transaction_identifier<false>::ToString_abi_cxx11_
                    ((transaction_identifier<false> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
          WalletLogPrintf<std::__cxx11::string>(this_01,wallet_fmt,in_RSI);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          pCVar4 = chain(this_00);
          uVar3 = (*pCVar4->_vptr_Chain[0x15])
                            (pCVar4,(undefined1 *)((long)&in_RSI[0xc].field_2 + 8),
                             &in_RDI->m_default_max_tx_fee,(ulong)(in_CL & 1),in_RDX);
          bVar5 = (byte)uVar3 & 1;
          if ((uVar3 & 1) != 0) {
            std::
            variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
            ::operator=((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         *)this_00,
                        (TxStateInMempool *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
          }
          local_2a = (bool)(bVar5 & 1);
        }
        else {
          local_2a = false;
        }
      }
    }
  }
  else {
    local_2a = false;
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == (pointer)wallet_fmt.fmt) {
    return local_2a;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::SubmitTxMemoryPoolAndRelay(CWalletTx& wtx, std::string& err_string, bool relay) const
{
    AssertLockHeld(cs_wallet);

    // Can't relay if wallet is not broadcasting
    if (!GetBroadcastTransactions()) return false;
    // Don't relay abandoned transactions
    if (wtx.isAbandoned()) return false;
    // Don't try to submit coinbase transactions. These would fail anyway but would
    // cause log spam.
    if (wtx.IsCoinBase()) return false;
    // Don't try to submit conflicted or confirmed transactions.
    if (GetTxDepthInMainChain(wtx) != 0) return false;

    // Submit transaction to mempool for relay
    WalletLogPrintf("Submitting wtx %s to mempool for relay\n", wtx.GetHash().ToString());
    // We must set TxStateInMempool here. Even though it will also be set later by the
    // entered-mempool callback, if we did not there would be a race where a
    // user could call sendmoney in a loop and hit spurious out of funds errors
    // because we think that this newly generated transaction's change is
    // unavailable as we're not yet aware that it is in the mempool.
    //
    // If broadcast fails for any reason, trying to set wtx.m_state here would be incorrect.
    // If transaction was previously in the mempool, it should be updated when
    // TransactionRemovedFromMempool fires.
    bool ret = chain().broadcastTransaction(wtx.tx, m_default_max_tx_fee, relay, err_string);
    if (ret) wtx.m_state = TxStateInMempool{};
    return ret;
}